

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
          (Builder *this,string_view attrName,Value *sub)

{
  string_view key;
  bool bVar1;
  reference pvVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  const_pointer start;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  element_type *in_RSI;
  ValuePair *in_RDI;
  ValueLength l;
  Slice item;
  uint8_t *translated;
  ValueLength to;
  bool haveReported;
  Value *in_stack_ffffffffffffff18;
  Builder *in_stack_ffffffffffffff20;
  Builder *this_00;
  ValueLength in_stack_ffffffffffffff28;
  Builder *in_stack_ffffffffffffff30;
  AttributeTranslator *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Builder *in_stack_ffffffffffffff70;
  Slice local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  uint8_t *local_48;
  ValueLength local_40;
  undefined1 local_31;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  uint8_t *local_8;
  
  local_31 = 0;
  local_20 = in_RSI;
  local_18._M_pi = in_RDX;
  bVar1 = std::
          vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
          ::empty((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                   *)in_stack_ffffffffffffff30);
  if (!bVar1) {
    pvVar2 = std::
             vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             ::back((vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                     *)in_stack_ffffffffffffff20);
    local_40 = pvVar2->startPos;
    bVar1 = false;
    if (in_RDI[1]._start[local_40] != '\v') {
      bVar1 = in_RDI[1]._start[local_40] != '\x14';
    }
    if (bVar1) {
      uVar3 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_ffffffffffffff20,
                 (ExceptionType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
    }
    if (((ulong)in_RDI[7]._start & 1) != 0) {
      uVar3 = __cxa_allocate_exception(0x18);
      Exception::Exception
                ((Exception *)in_stack_ffffffffffffff20,
                 (ExceptionType)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
    }
    reportAdd(in_stack_ffffffffffffff30);
    local_31 = 1;
  }
  if (*(long *)(in_RDI[7]._size + 8) != 0) {
    local_58 = local_20;
    local_50 = local_18._M_pi;
    key._M_str = in_stack_ffffffffffffff48;
    key._M_len = in_stack_ffffffffffffff40;
    local_48 = AttributeTranslator::translate(in_stack_ffffffffffffff38,key);
    if (local_48 != (uint8_t *)0x0) {
      Slice::Slice(&local_60,local_48);
      puVar4 = (uint8_t *)
               SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                         ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                          in_stack_ffffffffffffff20);
      reserve(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_8 = puVar4;
      memcpy(in_RDI[1]._start + in_RDI[1]._size,local_48,(size_t)puVar4);
      advance(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
      puVar4 = writeValue<arangodb::velocypack::Value>
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      return puVar4;
    }
    local_48 = (uint8_t *)0x0;
  }
  this_00 = (Builder *)&stack0xffffffffffffffe0;
  start = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
  ValuePair::ValuePair
            ((ValuePair *)&stack0xffffffffffffff70,start,(uint64_t)this_00,
             (ValueType)((ulong)in_stack_ffffffffffffff18 >> 0x38));
  set(in_stack_ffffffffffffff70,in_RDI);
  puVar4 = writeValue<arangodb::velocypack::Value>(this_00,in_stack_ffffffffffffff18);
  return puVar4;
}

Assistant:

uint8_t* addInternal(std::string_view attrName, T const& sub) {
    bool haveReported = false;
    if (!_stack.empty()) {
      ValueLength const to = _stack.back().startPos;
      if (VELOCYPACK_UNLIKELY(_start[to] != 0x0b && _start[to] != 0x14)) {
        throw Exception(Exception::BuilderNeedOpenObject);
      }
      if (VELOCYPACK_UNLIKELY(_keyWritten)) {
        throw Exception(Exception::BuilderKeyAlreadyWritten);
      }
      reportAdd();
      haveReported = true;
    }

    try {
      if (options->attributeTranslator != nullptr) {
        // check if a translation for the attribute name exists
        uint8_t const* translated =
            options->attributeTranslator->translate(attrName);

        if (translated != nullptr) {
          Slice item(translated);
          ValueLength const l = item.byteSize();
          reserve(l);
          memcpy(_start + _pos, translated, checkOverflow(l));
          advance(l);
          return writeValue(sub);
        }
        // otherwise fall through to regular behavior
      }

      set(ValuePair(attrName.data(), attrName.size(), ValueType::String));
      return writeValue(sub);
    } catch (...) {
      // clean up in case of an exception
      if (haveReported) {
        cleanupAdd();
      }
      throw;
    }
  }